

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

bool __thiscall
cmCTest::HandleTestModelArgument
          (cmCTest *this,char *ctestExec,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  long *plVar1;
  pointer pbVar2;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var3;
  bool bVar4;
  size_t sVar5;
  ostream *poVar6;
  size_t sVar7;
  bool bVar8;
  char *in_R8;
  string *s;
  string_view varg1;
  ostringstream cmCTestLog_msg;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  varg1._M_str = "--test-model";
  varg1._M_len = (size_t)"-M";
  bVar4 = CheckArgument((cmCTest *)
                        ((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + *i),(string *)0x2,varg1,in_R8)
  ;
  bVar8 = true;
  if (bVar4) {
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U) {
      sVar5 = *i + 1;
      *i = sVar5;
      s = pbVar2 + sVar5;
      cmsys::SystemTools::LowerCase((string *)local_1a8,s);
      if (local_1a8._8_8_ == 7) {
        bVar4 = *(int *)(local_1a8._0_8_ + 3) == 0x796c7468 && *(int *)local_1a8._0_8_ == 0x6867696e
        ;
      }
      else {
        bVar4 = false;
      }
      plVar1 = (long *)(local_1a8 + 0x10);
      if ((long *)local_1a8._0_8_ != plVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (bVar4) {
        _Var3._M_head_impl =
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
        (_Var3._M_head_impl)->InteractiveDebugMode = false;
        (_Var3._M_head_impl)->TestModel = 1;
      }
      else {
        cmsys::SystemTools::LowerCase((string *)local_1a8,s);
        if (local_1a8._8_8_ == 10) {
          bVar4 = (short)*(long *)(local_1a8._0_8_ + 8) == 0x7375 &&
                  *(long *)local_1a8._0_8_ == 0x6f756e69746e6f63;
        }
        else {
          bVar4 = false;
        }
        if ((long *)local_1a8._0_8_ != plVar1) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if (bVar4) {
          _Var3._M_head_impl =
               (this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
          (_Var3._M_head_impl)->InteractiveDebugMode = false;
          (_Var3._M_head_impl)->TestModel = 2;
        }
        else {
          cmsys::SystemTools::LowerCase((string *)local_1a8,s);
          if (local_1a8._8_8_ == 0xc) {
            bVar4 = (int)*(long *)(local_1a8._0_8_ + 8) == 0x6c61746e &&
                    *(long *)local_1a8._0_8_ == 0x656d697265707865;
          }
          else {
            bVar4 = false;
          }
          if ((long *)local_1a8._0_8_ != plVar1) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if (bVar4) {
            _Var3._M_head_impl =
                 (this->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
            (_Var3._M_head_impl)->InteractiveDebugMode = false;
            (_Var3._M_head_impl)->TestModel = 0;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"CTest -M called with incorrect option: ",0x27);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(s->_M_dataplus)._M_p,s->_M_string_length);
            std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
            std::__cxx11::stringbuf::str();
            Log(this,7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                ,0xb25,(char *)local_1c8,false);
            if (local_1c8 != local_1b8) {
              operator_delete(local_1c8,local_1b8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Available options are:",0x16);
            std::ios::widen((char)(ostringstream *)local_1a8 +
                            (char)*(long *)(local_1a8._0_8_ + -0x18));
            std::ostream::put((char)local_1a8);
            poVar6 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
            if (ctestExec == (char *)0x0) {
              std::ios::clear((int)poVar6 + (int)poVar6->_vptr_basic_ostream[-3]);
            }
            else {
              sVar7 = strlen(ctestExec);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,ctestExec,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," -M Continuous",0xe);
            std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
            std::ostream::put((char)poVar6);
            poVar6 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
            if (ctestExec == (char *)0x0) {
              std::ios::clear((int)poVar6 + (int)poVar6->_vptr_basic_ostream[-3]);
            }
            else {
              sVar7 = strlen(ctestExec);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,ctestExec,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," -M Experimental",0x10);
            std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
            std::ostream::put((char)poVar6);
            poVar6 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
            if (ctestExec == (char *)0x0) {
              std::ios::clear((int)poVar6 + (int)poVar6->_vptr_basic_ostream[-3]);
            }
            else {
              sVar7 = strlen(ctestExec);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,ctestExec,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," -M Nightly",0xb);
            std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
            std::__cxx11::stringbuf::str();
            Log(this,7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                ,0xb2b,(char *)local_1c8,false);
            if (local_1c8 != local_1b8) {
              operator_delete(local_1c8,local_1b8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            bVar8 = false;
          }
        }
      }
    }
  }
  return bVar8;
}

Assistant:

bool cmCTest::HandleTestModelArgument(const char* ctestExec, size_t& i,
                                      const std::vector<std::string>& args)
{
  bool success = true;
  std::string const& arg = args[i];
  if (this->CheckArgument(arg, "-M"_s, "--test-model") &&
      (i < args.size() - 1)) {
    i++;
    std::string const& str = args[i];
    if (cmSystemTools::LowerCase(str) == "nightly"_s) {
      this->SetTestModel(cmCTest::NIGHTLY);
    } else if (cmSystemTools::LowerCase(str) == "continuous"_s) {
      this->SetTestModel(cmCTest::CONTINUOUS);
    } else if (cmSystemTools::LowerCase(str) == "experimental"_s) {
      this->SetTestModel(cmCTest::EXPERIMENTAL);
    } else {
      success = false;
      cmCTestLog(this, ERROR_MESSAGE,
                 "CTest -M called with incorrect option: " << str
                                                           << std::endl);
      cmCTestLog(this, ERROR_MESSAGE,
                 "Available options are:"
                   << std::endl
                   << "  " << ctestExec << " -M Continuous" << std::endl
                   << "  " << ctestExec << " -M Experimental" << std::endl
                   << "  " << ctestExec << " -M Nightly" << std::endl);
    }
  }
  return success;
}